

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O3

void __thiscall
QTextCursor::insertMarkdown(QTextCursor *this,QString *markdown,MarkdownFeatures features)

{
  char cVar1;
  bool bVar2;
  QTextCursorPrivate *pQVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QTextDocumentFragment fragment;
  QTextDocumentFragment local_70;
  QString local_68;
  undefined1 local_48 [16];
  qsizetype local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->d).d.ptr;
  if (pQVar3 != (QTextCursorPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      pQVar3 = (this->d).d.ptr;
    }
    if (pQVar3->priv != (QTextDocumentPrivate *)0x0) {
      local_70.d = (QTextDocumentFragmentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QTextDocumentFragment::fromMarkdown(&local_70,markdown,features);
      cVar1 = QString::startsWith((QChar)(char16_t)markdown,10);
      if (cVar1 != '\0') {
        QTextDocument::firstBlock((QTextDocument *)&local_68);
        QTextBlock::blockFormat((QTextBlock *)local_48);
        insertBlock(this,(QTextBlockFormat *)local_48);
        QTextFormat::~QTextFormat((QTextFormat *)local_48);
      }
      insertFragment(this,&local_70);
      bVar2 = atEnd(this);
      if (!bVar2) {
        cVar1 = QString::endsWith((QChar)(char16_t)markdown,10);
        if (cVar1 != '\0') {
          QVar4.m_data = (storage_type *)0x1;
          QVar4.m_size = (qsizetype)local_48;
          QString::fromLatin1(QVar4);
          local_68.d.d = (Data *)local_48._0_8_;
          local_68.d.ptr = (char16_t *)local_48._8_8_;
          local_68.d.size = local_38;
          insertText(this,&local_68);
          if ((QTextFormatPrivate *)local_68.d.d != (QTextFormatPrivate *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      QTextDocumentFragment::~QTextDocumentFragment(&local_70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursor::insertMarkdown(const QString &markdown, QTextDocument::MarkdownFeatures features)
{
    if (!d || !d->priv)
        return;
    QTextDocumentFragment fragment = QTextDocumentFragment::fromMarkdown(markdown, features);
    if (markdown.startsWith(QLatin1Char('\n')))
        insertBlock(fragment.d->doc->firstBlock().blockFormat());
    insertFragment(fragment);
    if (!atEnd() && markdown.endsWith(QLatin1Char('\n')))
        insertText(QLatin1String("\n"));
}